

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_tree_builder.h
# Opt level: O0

vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
* __thiscall
bvh::v2::MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int>::prune_mini_trees
          (vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
           *__return_storage_ptr__,
          MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int> *this,
          vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
          *mini_trees)

{
  float fVar1;
  undefined8 uVar2;
  ThreadPool *this_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  reference pvVar5;
  unsigned_long uVar6;
  bool bVar7;
  const_reference pvVar8;
  size_type sVar9;
  reference pvVar10;
  size_t sVar11;
  unsigned_long *puVar12;
  Task *task;
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  anon_class_24_3_47abbb90 local_720;
  allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_> local_702;
  undefined1 local_701;
  ulong local_700;
  ulong local_6f8;
  Vec<float,_3UL> local_6f0;
  Vec<float,_3UL> local_6e4;
  reference local_6d8;
  value_type *node;
  value_type node_id;
  value_type *mini_tree_1;
  value_type local_6b0;
  unsigned_long local_6a8;
  size_t i;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  pruned_roots;
  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> stack;
  undefined8 uStack_630;
  Scalar threshold;
  float local_628;
  Vec<float,_3UL> local_624;
  reference local_618;
  Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *mini_tree;
  iterator __end0;
  iterator __begin0;
  vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
  *__range3;
  Scalar avg_area;
  vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
  *mini_trees_local;
  MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int> *this_local;
  vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
  *pruned_trees;
  float local_5bc;
  float fStack_5b8;
  Vec<float,_3UL> d_1;
  anon_class_16_2_94731e0a local_500;
  Vec<float,_3UL> *local_4f0;
  Vec<float,_3UL> *local_4e8;
  undefined8 local_4e0;
  float local_4d8;
  undefined8 local_4d0;
  float local_4c8;
  anon_class_16_2_94732099 local_4c0;
  anon_class_16_2_94731e0a *local_4b0;
  undefined1 local_4a4 [8];
  Vec<float,_3UL> v_5;
  float local_464;
  float fStack_460;
  Vec<float,_3UL> d;
  anon_class_16_2_94731e0a local_3a8;
  Vec<float,_3UL> *local_398;
  Vec<float,_3UL> *local_390;
  undefined8 local_388;
  float local_380;
  undefined8 local_378;
  float local_370;
  anon_class_16_2_94732099 local_368;
  anon_class_16_2_94731e0a *local_358;
  undefined1 local_34c [8];
  Vec<float,_3UL> v_2;
  anon_class_8_1_8991fb9c local_310;
  float local_304 [2];
  float local_2fc;
  float local_2f8 [2];
  float local_2f0;
  anon_class_8_1_8991fb9c local_2e8;
  float local_2e0 [2];
  float local_2d8;
  reference local_2d0;
  float *local_2c8;
  float *local_2c0;
  Vec<float,_3UL> *local_2b8;
  float local_2b0 [2];
  float local_2a8;
  anon_class_8_1_8991fb9c local_2a0;
  float local_298 [2];
  float local_290;
  undefined8 local_288;
  float local_280;
  anon_class_8_1_8991fb9c local_278;
  undefined8 local_270;
  float local_268;
  const_reference local_260;
  float *local_258;
  undefined8 *local_250;
  Vec<float,_3UL> *local_248;
  undefined8 local_240;
  float local_238;
  anon_class_16_2_94732099 local_230;
  anon_class_8_1_8991fb9c *local_220;
  undefined1 local_214 [8];
  Vec<float,_3UL> v;
  anon_class_16_2_94732099 local_1f8;
  anon_class_8_1_8991fb9c *local_1e8;
  undefined1 local_1dc [8];
  Vec<float,_3UL> v_3;
  anon_class_16_2_94732099 local_1c0;
  anon_class_8_1_8991fb9c *local_1b0;
  undefined1 local_1a4 [8];
  Vec<float,_3UL> v_1;
  anon_class_16_2_94732099 local_188;
  anon_class_8_1_8991fb9c *local_178;
  undefined1 local_16c [8];
  Vec<float,_3UL> v_4;
  anon_class_40_3_92fce145_conflict local_a8;
  Task local_78;
  _Manager_type local_58;
  unsigned_long local_50;
  size_t next;
  size_t i_1;
  unsigned_long local_38;
  _Manager_type local_30;
  unsigned_long chunk_size;
  size_type local_20;
  size_t local_18;
  MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int> *local_10;
  
  auVar14 = ZEXT1664((undefined1  [16])0x0);
  __range3._4_4_ = 0.0;
  __end0 = std::
           vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
           ::begin(mini_trees);
  mini_tree = (Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *)
              std::
              vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
              ::end(mini_trees);
  while( true ) {
    auVar13 = auVar14._0_16_;
    bVar7 = __gnu_cxx::
            operator==<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_*,_std::vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>_>
                      (&__end0,(__normal_iterator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_*,_std::vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>_>
                                *)&mini_tree);
    if (((bVar7 ^ 0xffU) & 1) == 0) break;
    local_618 = __gnu_cxx::
                __normal_iterator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_*,_std::vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>_>
                ::operator*(&__end0);
    pvVar8 = std::
             vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
             ::operator[](&local_618->nodes,0);
    local_230.f = &local_278;
    local_230.v = (Vec<float,_3UL> *)local_214;
    local_278.this = pvVar8;
    local_260 = pvVar8;
    local_220 = local_230.f;
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:48:35)>
    ::anon_class_16_2_94732099::operator()(&local_230,0);
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:48:35)>
    ::anon_class_16_2_94732099::operator()(&local_230,1);
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:48:35)>
    ::anon_class_16_2_94732099::operator()(&local_230,2);
    local_238 = v.values[0];
    local_240 = local_214;
    local_280 = v.values[0];
    local_288 = local_214;
    local_268 = v.values[0];
    local_270 = local_214;
    local_1c0.f = &local_2a0;
    local_1c0.v = (Vec<float,_3UL> *)local_1a4;
    local_2a0.this = pvVar8;
    local_1b0 = local_1c0.f;
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:49:35)>
    ::anon_class_16_2_94732099::operator()(&local_1c0,0);
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:49:35)>
    ::anon_class_16_2_94732099::operator()(&local_1c0,1);
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:49:35)>
    ::anon_class_16_2_94732099::operator()(&local_1c0,2);
    v_3.values[1] = (float)local_1a4._0_4_;
    v_3.values[2] = (float)local_1a4._4_4_;
    local_2a8 = v_1.values[0];
    local_2b0[0] = (float)local_1a4._0_4_;
    local_2b0[1] = (float)local_1a4._4_4_;
    local_290 = v_1.values[0];
    local_298[0] = (float)local_1a4._0_4_;
    local_298[1] = (float)local_1a4._4_4_;
    local_3a8.b = (Vec<float,_3UL> *)&stack0xfffffffffffff9d0;
    local_250 = &local_270;
    local_258 = local_298;
    local_628 = local_268;
    uStack_630 = local_270;
    local_3a8.a = &local_624;
    local_368.f = &local_3a8;
    local_368.v = (Vec<float,_3UL> *)local_34c;
    v_2.values._4_8_ = &local_368;
    local_398 = local_3a8.b;
    local_390 = local_3a8.a;
    local_358 = local_368.f;
    local_248 = local_3a8.b;
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:54:32)>
    ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_2.values._4_8_,0);
    uVar2 = v_2.values._4_8_;
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:54:32)>
    ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_2.values._4_8_,1);
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:54:32)>
    ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar2,2);
    local_370 = v_2.values[0];
    local_378 = local_34c;
    local_380 = v_2.values[0];
    local_388 = local_34c;
    local_464 = local_34c._0_4_;
    fStack_460 = local_34c._4_4_;
    auVar13 = vfmadd213ss_fma(ZEXT416((uint)v_2.values[0]),ZEXT416((uint)(local_464 + fStack_460)),
                              ZEXT416((uint)(local_464 * fStack_460)));
    __range3._4_4_ = auVar13._0_4_ + __range3._4_4_;
    auVar14 = ZEXT464((uint)__range3._4_4_);
    __gnu_cxx::
    __normal_iterator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_*,_std::vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>_>
    ::operator++(&__end0);
  }
  sVar9 = std::
          vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
          ::size(mini_trees);
  auVar13 = vcvtusi2ss_avx512f(auVar13,sVar9);
  fVar1 = this->config_->pruning_area_ratio;
  std::stack<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>::
  stack<std::deque<unsigned_long,std::allocator<unsigned_long>>,void>
            ((stack<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>> *)
             &pruned_roots.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            *)&i);
  for (local_6a8 = 0; uVar6 = local_6a8,
      sVar9 = std::
              vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
              ::size(mini_trees), uVar6 < sVar9; local_6a8 = local_6a8 + 1) {
    local_6b0 = 0;
    std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::push
              ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
               &pruned_roots.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_6b0);
    node_id = (value_type)
              std::
              vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
              ::operator[](mini_trees,local_6a8);
    while (bVar7 = std::
                   stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::empty((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)&pruned_roots.
                               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage),
          ((bVar7 ^ 0xffU) & 1) != 0) {
      pvVar10 = std::
                stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
                top((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                     *)&pruned_roots.
                        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      node = (value_type *)*pvVar10;
      local_6d8 = std::
                  vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                  ::operator[]((vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                *)node_id,(size_type)node);
      std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::pop
                ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *
                 )&pruned_roots.
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar5 = local_6d8;
      local_2d0 = local_6d8;
      local_2e8.this = local_6d8;
      local_1f8.f = &local_2e8;
      local_1f8.v = (Vec<float,_3UL> *)local_1dc;
      v_4.values._4_8_ = &local_1f8;
      local_1e8 = local_1f8.f;
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:48:35)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_4.values._4_8_,0);
      uVar2 = v_4.values._4_8_;
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:48:35)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_4.values._4_8_,1);
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:48:35)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar2,2);
      v.values[1] = (float)local_1dc._0_4_;
      v.values[2] = (float)local_1dc._4_4_;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_1dc;
      local_2f8 = (float  [2])vmovlpd_avx(auVar4);
      local_2f0 = v_3.values[0];
      local_2d8 = v_3.values[0];
      local_310.this = pvVar5;
      local_188.f = &local_310;
      local_188.v = (Vec<float,_3UL> *)local_16c;
      local_2e0 = local_2f8;
      local_178 = local_188.f;
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:49:35)>
      ::anon_class_16_2_94732099::operator()(&local_188,0);
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:49:35)>
      ::anon_class_16_2_94732099::operator()(&local_188,1);
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:49:35)>
      ::anon_class_16_2_94732099::operator()(&local_188,2);
      v_1.values[1] = (float)local_16c._0_4_;
      v_1.values[2] = (float)local_16c._4_4_;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_16c;
      uVar2 = vmovlpd_avx(auVar3);
      local_2fc = v_4.values[0];
      local_2b8 = &local_6f0;
      local_2c0 = local_2e0;
      local_2c8 = local_304;
      local_6f0.values[0] = local_2e0[0];
      local_6f0.values[1] = local_2e0[1];
      local_6f0.values[2] = local_2d8;
      local_6e4.values[0] = local_304[0];
      local_6e4.values[1] = local_304[1];
      local_500.b = &local_6f0;
      local_500.a = &local_6e4;
      local_4c0.f = &local_500;
      local_4c0.v = (Vec<float,_3UL> *)local_4a4;
      v_5.values._4_8_ = &local_4c0;
      local_4f0 = local_500.b;
      local_4e8 = local_500.a;
      local_4b0 = local_4c0.f;
      local_304 = (float  [2])uVar2;
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:54:32)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_5.values._4_8_,0);
      uVar2 = v_5.values._4_8_;
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:54:32)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_5.values._4_8_,1);
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:54:32)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar2,2);
      local_4c8 = v_5.values[0];
      local_4d0 = local_4a4;
      local_4d8 = v_5.values[0];
      local_4e0 = local_4a4;
      local_5bc = local_4a4._0_4_;
      fStack_5b8 = local_4a4._4_4_;
      auVar3 = vfmadd213ss_fma(ZEXT416((uint)v_5.values[0]),ZEXT416((uint)(local_5bc + fStack_5b8)),
                               ZEXT416((uint)(local_5bc * fStack_5b8)));
      bVar7 = true;
      if ((__range3._4_4_ / auVar13._0_4_) * fVar1 <= auVar3._0_4_) {
        bVar7 = ((local_6d8->index).value & 0xf) != 0;
      }
      if (bVar7) {
        std::
        vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<unsigned_long&,unsigned_long&>
                  ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&i,&local_6a8,(unsigned_long *)&node);
      }
      else {
        local_6f8 = (ulong)((local_6d8->index).value >> 4);
        std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::push
                  ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)&pruned_roots.
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_6f8);
        local_700 = (ulong)(((local_6d8->index).value >> 4) + 1);
        std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::push
                  ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)&pruned_roots.
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_700);
      }
    }
  }
  local_701 = 0;
  sVar9 = std::
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ::size((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  *)&i);
  std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>::allocator(&local_702);
  std::
  vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
  ::vector(__return_storage_ptr__,sVar9,&local_702);
  std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>::~allocator(&local_702);
  sVar9 = std::
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ::size((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  *)&i);
  local_720.pruned_roots =
       (vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        *)&i;
  local_18 = 0;
  chunk_size = (unsigned_long)&local_720;
  local_720.pruned_trees = __return_storage_ptr__;
  local_720.mini_trees = mini_trees;
  local_20 = sVar9;
  local_10 = this;
  if (sVar9 < (this->executor_).parallel_threshold) {
    prune_mini_trees::anon_class_24_3_47abbb90::operator()
              ((anon_class_24_3_47abbb90 *)chunk_size,0,sVar9);
  }
  else {
    local_38 = 1;
    sVar11 = ThreadPool::get_thread_count((this->executor_).thread_pool);
    i_1 = sVar9 / sVar11;
    task = (Task *)&i_1;
    puVar12 = std::max<unsigned_long>(&local_38,(unsigned_long *)task);
    local_30 = (_Manager_type)*puVar12;
    for (next = local_18; next < local_20; next = (size_t)(local_30 + next)) {
      local_58 = local_30 + next;
      puVar12 = std::min<unsigned_long>(&local_20,(unsigned_long *)&local_58);
      local_a8.next = *puVar12;
      this_00 = (this->executor_).thread_pool;
      local_a8.loop.mini_trees =
           *(vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
             **)(chunk_size + 0x10);
      local_a8.loop.pruned_roots =
           *(vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             **)chunk_size;
      local_a8.loop.pruned_trees =
           *(vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
             **)(chunk_size + 8);
      local_a8.i = next;
      local_50 = local_a8.next;
      std::function<void(unsigned_long)>::
      function<bvh::v2::ParallelExecutor::for_each<bvh::v2::MiniTreeBuilder<bvh::v2::Node<float,3ul,32ul,4ul>,unsigned_int>::prune_mini_trees(std::vector<bvh::v2::Bvh<bvh::v2::Node<float,3ul,32ul,4ul>>,std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,3ul,32ul,4ul>>>>&&)::_lambda(unsigned_long,unsigned_long)_1_>(unsigned_long,unsigned_long,bvh::v2::MiniTreeBuilder<bvh::v2::Node<float,3ul,32ul,4ul>,unsigned_int>::prune_mini_trees(std::vector<bvh::v2::Bvh<bvh::v2::Node<float,3ul,32ul,4ul>>,std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,3ul,32ul,4ul>>>>&&)::_lambda(unsigned_long,unsigned_long)_1_const&)::_lambda(unsigned_long)_1_,void>
                ((function<void(unsigned_long)> *)&local_78,&local_a8);
      task = &local_78;
      ThreadPool::push(this_00,task);
      std::function<void_(unsigned_long)>::~function(&local_78);
    }
    ThreadPool::wait((this->executor_).thread_pool,task);
  }
  local_701 = 1;
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             *)&i);
  std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::~stack
            ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &pruned_roots.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Bvh<Node>> prune_mini_trees(std::vector<Bvh<Node>>&& mini_trees) {
        // Compute the area threshold based on the area of the entire set of primitives
        auto avg_area = static_cast<Scalar>(0.);
        for (auto& mini_tree : mini_trees)
            avg_area += mini_tree.get_root().get_bbox().get_half_area();
        avg_area /= static_cast<Scalar>(mini_trees.size());
        auto threshold = avg_area * config_.pruning_area_ratio;

        // Cull nodes whose area is above the threshold
        std::stack<size_t> stack;
        std::vector<std::pair<size_t, size_t>> pruned_roots;
        for (size_t i = 0; i < mini_trees.size(); ++i) {
            stack.push(0);
            auto& mini_tree = mini_trees[i];
            while (!stack.empty()) {
                auto node_id = stack.top();
                auto& node = mini_tree.nodes[node_id];
                stack.pop();
                if (node.get_bbox().get_half_area() < threshold || node.is_leaf()) {
                    pruned_roots.emplace_back(i, node_id);
                } else {
                    stack.push(node.index.first_id());
                    stack.push(node.index.first_id() + 1);
                }
            }
        }

        // Extract the BVHs rooted at the previously computed indices
        std::vector<Bvh<Node>> pruned_trees(pruned_roots.size());
        executor_.for_each(0, pruned_roots.size(),
            [&] (size_t begin, size_t end) {
                for (size_t i = begin; i < end; ++i) {
                    if (pruned_roots[i].second == 0)
                        pruned_trees[i] = std::move(mini_trees[pruned_roots[i].first]);
                    else
                        pruned_trees[i] = mini_trees[pruned_roots[i].first]
                            .extract_bvh(pruned_roots[i].second);
                }
            });
        return pruned_trees;
    }